

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O0

int Proj(sunrealtype t,N_Vector ycur,N_Vector corr,sunrealtype epsProj,N_Vector err,void *user_data)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar5;
  double dVar6;
  sunrealtype erryp;
  sunrealtype errxp;
  sunrealtype r;
  sunrealtype yp;
  sunrealtype xp;
  sunrealtype y;
  sunrealtype x;
  sunrealtype *edata;
  sunrealtype *cdata;
  sunrealtype *ydata;
  
  pdVar3 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar4 = (double *)N_VGetArrayPointer(in_RSI);
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  dVar5 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
  dVar6 = dVar1 / dVar5;
  dVar5 = dVar2 / dVar5;
  *pdVar4 = dVar6 - dVar1;
  pdVar4[1] = dVar5 - dVar2;
  if (in_RDX != 0) {
    pdVar3 = (double *)N_VGetArrayPointer(in_RDX);
    dVar1 = *pdVar3;
    *pdVar3 = *pdVar3 * dVar5 * dVar5 + -(pdVar3[1] * dVar6 * dVar5);
    pdVar3[1] = -dVar1 * dVar6 * dVar5 + pdVar3[1] * dVar6 * dVar6;
  }
  return 0;
}

Assistant:

static int Proj(sunrealtype t, N_Vector ycur, N_Vector corr,
                sunrealtype epsProj, N_Vector err, void* user_data)
{
  sunrealtype* ydata = N_VGetArrayPointer(ycur);
  sunrealtype* cdata = N_VGetArrayPointer(corr);
  sunrealtype* edata = NULL;
  sunrealtype x      = ydata[0];
  sunrealtype y      = ydata[1];
  sunrealtype xp, yp, r;
  sunrealtype errxp, erryp;

  /* project onto the unit circle */
  r = SQRT(x * x + y * y);

  xp = x / r;
  yp = y / r;

  /* correction to the unprojected solution */
  cdata[0] = xp - x;
  cdata[1] = yp - y;

  /* project the error */
  if (err != NULL)
  {
    edata = N_VGetArrayPointer(err);

    errxp = edata[0] * yp * yp - edata[1] * xp * yp;
    erryp = -edata[0] * xp * yp + edata[1] * xp * xp;

    edata[0] = errxp;
    edata[1] = erryp;
  }

  return (0);
}